

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O1

int __thiscall QSyntaxHighlighter::previousBlockState(QSyntaxHighlighter *this)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QTextBlock::isValid((QTextBlock *)(*(long *)&this->field_0x8 + 0xa0));
  iVar2 = -1;
  if (bVar1) {
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::previous((QTextBlock *)local_28);
    bVar1 = QTextBlock::isValid((QTextBlock *)local_28);
    iVar2 = -1;
    if (bVar1) {
      iVar2 = QTextBlock::userState((QTextBlock *)local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QSyntaxHighlighter::previousBlockState() const
{
    Q_D(const QSyntaxHighlighter);
    if (!d->currentBlock.isValid())
        return -1;

    const QTextBlock previous = d->currentBlock.previous();
    if (!previous.isValid())
        return -1;

    return previous.userState();
}